

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O3

void __thiscall fdtd_solver::advance_e(fdtd_solver *this)

{
  cellb **ppcVar1;
  cellj **ppcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  uint uVar15;
  field3d<celle> *pfVar16;
  cellb **ppcVar17;
  cellb *pcVar18;
  cellb *pcVar19;
  cellj *pcVar20;
  celle *pcVar21;
  cellb ***pppcVar22;
  field3d<cellb> *pfVar23;
  field3d<cellj> *pfVar24;
  cellb **ppcVar25;
  cellj **ppcVar26;
  celle **ppcVar27;
  byte bVar28;
  bool bVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  long lVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  double *pdVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar77 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 in_ZMM26 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar76 [64];
  undefined1 auVar78 [64];
  
  pfVar16 = (this->super_maxwell_solver).ce;
  uVar13 = pfVar16->nx;
  iVar14 = pfVar16->ny;
  uVar15 = pfVar16->nz;
  uVar38 = (ulong)uVar15;
  uVar36 = iVar14 - 1;
  uVar37 = (ulong)(uVar13 - 1);
  if (2 < (int)uVar13) {
    auVar48 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar50 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar51 = vpbroadcastq_avx512f(ZEXT816(8));
    uVar40 = (ulong)uVar36;
    uVar41 = 1;
    auVar52 = vpbroadcastq_avx512f();
    do {
      if (2 < iVar14) {
        uVar39 = 1;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = (this->super_maxwell_solver).dtdz;
        auVar53 = vbroadcastsd_avx512f(auVar43);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = (this->super_maxwell_solver).dtdx;
        auVar54 = vbroadcastsd_avx512f(auVar44);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = (this->super_maxwell_solver).dtdy;
        auVar55 = vbroadcastsd_avx512f(auVar45);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (this->super_maxwell_solver).dx;
        auVar56 = vbroadcastsd_avx512f(auVar3);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (this->super_maxwell_solver).dy;
        auVar57 = vbroadcastsd_avx512f(auVar4);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (this->super_maxwell_solver).dz;
        auVar58 = vbroadcastsd_avx512f(auVar5);
        auVar92._0_8_ = auVar53._0_8_ ^ 0x8000000000000000;
        auVar92._8_8_ = auVar53._8_8_ ^ 0x8000000000000000;
        auVar93._0_8_ = auVar54._0_8_ ^ 0x8000000000000000;
        auVar93._8_8_ = auVar54._8_8_ ^ 0x8000000000000000;
        auVar94._0_8_ = auVar55._0_8_ ^ 0x8000000000000000;
        auVar94._8_8_ = auVar55._8_8_ ^ 0x8000000000000000;
        auVar59 = vbroadcastsd_avx512f(auVar92);
        auVar60 = vbroadcastsd_avx512f(auVar93);
        auVar61 = vbroadcastsd_avx512f(auVar94);
        do {
          if (2 < (int)uVar15) {
            auVar62 = vmovdqa64_avx512f(auVar48);
            ppcVar17 = (((this->super_maxwell_solver).cb)->p)._M_t.
                       super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                       super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                       super__Head_base<0UL,_cellb_***,_false>._M_head_impl[uVar41];
            pcVar18 = ppcVar17[uVar39];
            pcVar19 = ppcVar17[uVar39 - 1];
            auVar6._8_8_ = 0;
            auVar6._0_8_ = pcVar18->bx;
            auVar63 = vbroadcastsd_avx512f(auVar6);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = pcVar18->by;
            auVar64 = vbroadcastsd_avx512f(auVar7);
            auVar65 = vpbroadcastq_avx512f();
            pcVar20 = (((this->super_maxwell_solver).cj)->p)._M_t.
                      super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                      super__Head_base<0UL,_cellj_***,_false>._M_head_impl[uVar41][uVar39];
            auVar66 = vpbroadcastq_avx512f();
            pcVar21 = (pfVar16->p)._M_t.
                      super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                      super__Head_base<0UL,_celle_***,_false>._M_head_impl[uVar41][uVar39];
            auVar67 = vpbroadcastq_avx512f();
            auVar68 = vpbroadcastq_avx512f();
            uVar35 = 0;
            do {
              auVar69 = vpbroadcastq_avx512f();
              auVar70 = vpmullq_avx512dq(auVar62,auVar50);
              auVar43 = vxorpd_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
              auVar44 = vxorpd_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
              uVar35 = uVar35 + 8;
              auVar62 = vpaddq_avx512f(auVar62,auVar51);
              auVar69 = vporq_avx512f(auVar69,auVar49);
              uVar30 = vpcmpuq_avx512f(auVar69,auVar52,2);
              auVar45 = vpxord_avx512vl(auVar69._0_16_,auVar69._0_16_);
              vpaddq_avx512f(auVar65,auVar70);
              vpaddq_avx512f(auVar67,auVar70);
              auVar69 = vgatherqpd_avx512f(*(undefined8 *)(uVar38 + 0x10));
              bVar28 = (byte)uVar30;
              auVar71._0_8_ =
                   (ulong)(bVar28 & 1) * auVar69._0_8_ | (ulong)!(bool)(bVar28 & 1) * auVar43._0_8_;
              bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar71._8_8_ = (ulong)bVar29 * auVar69._8_8_ | (ulong)!bVar29 * auVar43._8_8_;
              auVar71._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * auVar69._16_8_;
              auVar71._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * auVar69._24_8_;
              auVar71._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * auVar69._32_8_;
              auVar71._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * auVar69._40_8_;
              auVar71._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * auVar69._48_8_;
              auVar71._56_8_ = (uVar30 >> 7) * auVar69._56_8_;
              auVar72 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar19->bz + (long)pcVar20));
              auVar69._0_8_ =
                   (ulong)(bVar28 & 1) * auVar72._0_8_ | (ulong)!(bool)(bVar28 & 1) * auVar44._0_8_;
              bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar69._8_8_ = (ulong)bVar29 * auVar72._8_8_ | (ulong)!bVar29 * auVar44._8_8_;
              auVar69._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * auVar72._16_8_;
              auVar69._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * auVar72._24_8_;
              auVar69._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * auVar72._32_8_;
              auVar69._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * auVar72._40_8_;
              auVar69._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * auVar72._48_8_;
              auVar69._56_8_ = (uVar30 >> 7) * auVar72._56_8_;
              auVar72 = vgatherqpd_avx512f(*(undefined8 *)(uVar38 + 8));
              auVar73._0_8_ =
                   (ulong)(bVar28 & 1) * auVar72._0_8_ | (ulong)!(bool)(bVar28 & 1) * auVar45._0_8_;
              bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar73._8_8_ = (ulong)bVar29 * auVar72._8_8_ | (ulong)!bVar29 * auVar45._8_8_;
              auVar73._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * auVar72._16_8_;
              auVar73._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * auVar72._24_8_;
              auVar73._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * auVar72._32_8_;
              auVar73._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * auVar72._40_8_;
              auVar73._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * auVar72._48_8_;
              auVar73._56_8_ = (uVar30 >> 7) * auVar72._56_8_;
              auVar69 = vsubpd_avx512f(auVar71,auVar69);
              auVar64 = vpermt2pd_avx512f(_DAT_00139040,auVar64);
              auVar64 = vsubpd_avx512f(auVar73,auVar64);
              vpaddq_avx512f(auVar66,auVar70);
              auVar64 = vmulpd_avx512f(auVar64,auVar59);
              auVar64 = vfmadd231pd_avx512f(auVar64,auVar55,auVar69);
              auVar43 = vxorpd_avx512vl(auVar69._0_16_,auVar69._0_16_);
              auVar69 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar20 * 2));
              auVar72._0_8_ =
                   (ulong)(bVar28 & 1) * auVar69._0_8_ | (ulong)!(bool)(bVar28 & 1) * auVar43._0_8_;
              bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar72._8_8_ = (ulong)bVar29 * auVar69._8_8_ | (ulong)!bVar29 * auVar43._8_8_;
              auVar72._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * auVar69._16_8_;
              auVar72._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * auVar69._24_8_;
              auVar72._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * auVar69._32_8_;
              auVar72._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * auVar69._40_8_;
              auVar72._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * auVar69._48_8_;
              auVar72._56_8_ = (uVar30 >> 7) * auVar69._56_8_;
              auVar69 = vfnmadd213pd_avx512f(auVar72,auVar56,auVar64);
              auVar43 = vxorpd_avx512vl(auVar64._0_16_,auVar64._0_16_);
              auVar64 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar20->jx + (long)&pcVar21->ex))
              ;
              auVar74._0_8_ =
                   (ulong)(bVar28 & 1) * auVar64._0_8_ | (ulong)!(bool)(bVar28 & 1) * auVar43._0_8_;
              bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar74._8_8_ = (ulong)bVar29 * auVar64._8_8_ | (ulong)!bVar29 * auVar43._8_8_;
              auVar74._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * auVar64._16_8_;
              auVar74._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * auVar64._24_8_;
              auVar74._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * auVar64._32_8_;
              auVar74._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * auVar64._40_8_;
              auVar74._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * auVar64._48_8_;
              auVar74._56_8_ = (uVar30 >> 7) * auVar64._56_8_;
              auVar64 = vaddpd_avx512f(auVar69,auVar74);
              in_ZMM27 = vpaddq_avx512f(auVar68,auVar70);
              vscatterqpd_avx512f(ZEXT864(pcVar21) + auVar51,uVar30,auVar64);
              auVar43 = vxorpd_avx512vl(auVar64._0_16_,auVar64._0_16_);
              auVar64 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar20->jx + (long)&pcVar18->bx))
              ;
              auVar70._0_8_ =
                   (ulong)(bVar28 & 1) * auVar64._0_8_ | (ulong)!(bool)(bVar28 & 1) * auVar43._0_8_;
              bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar70._8_8_ = (ulong)bVar29 * auVar64._8_8_ | (ulong)!bVar29 * auVar43._8_8_;
              auVar70._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * auVar64._16_8_;
              auVar70._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * auVar64._24_8_;
              auVar70._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * auVar64._32_8_;
              auVar70._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * auVar64._40_8_;
              auVar70._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * auVar64._48_8_;
              auVar70._56_8_ = (uVar30 >> 7) * auVar64._56_8_;
              auVar64 = vpermt2pd_avx512f(_DAT_00139040,auVar63);
              auVar43 = vxorpd_avx512vl(auVar63._0_16_,auVar63._0_16_);
              auVar63 = vgatherqpd_avx512f(*(undefined8 *)(uVar39 + 0x10));
              auVar75._0_8_ =
                   (ulong)(bVar28 & 1) * auVar63._0_8_ | (ulong)!(bool)(bVar28 & 1) * auVar43._0_8_;
              bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar75._8_8_ = (ulong)bVar29 * auVar63._8_8_ | (ulong)!bVar29 * auVar43._8_8_;
              auVar75._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * auVar63._16_8_;
              auVar75._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * auVar63._24_8_;
              auVar75._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * auVar63._32_8_;
              auVar75._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * auVar63._40_8_;
              auVar75._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * auVar63._48_8_;
              auVar75._56_8_ = (uVar30 >> 7) * auVar63._56_8_;
              auVar63 = vsubpd_avx512f(auVar70,auVar64);
              auVar64 = vsubpd_avx512f(auVar71,auVar75);
              auVar63 = vmulpd_avx512f(auVar53,auVar63);
              auVar63 = vfmadd231pd_avx512f(auVar63,auVar60,auVar64);
              auVar43 = vxorpd_avx512vl(auVar64._0_16_,auVar64._0_16_);
              auVar69 = vgatherqpd_avx512f(*(undefined8 *)(uVar38 + 8));
              auVar64._0_8_ =
                   (ulong)(bVar28 & 1) * auVar69._0_8_ | (ulong)!(bool)(bVar28 & 1) * auVar43._0_8_;
              bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar64._8_8_ = (ulong)bVar29 * auVar69._8_8_ | (ulong)!bVar29 * auVar43._8_8_;
              auVar64._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * auVar69._16_8_;
              auVar64._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * auVar69._24_8_;
              auVar64._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * auVar69._32_8_;
              auVar64._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * auVar69._40_8_;
              auVar64._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * auVar69._48_8_;
              auVar64._56_8_ = (uVar30 >> 7) * auVar69._56_8_;
              auVar64 = vfnmadd213pd_avx512f(auVar64,auVar57,auVar63);
              auVar43 = vxorpd_avx512vl(auVar63._0_16_,auVar63._0_16_);
              auVar63 = vgatherqpd_avx512f(*(undefined8 *)(uVar40 + 8));
              auVar46._0_8_ =
                   (ulong)(bVar28 & 1) * auVar63._0_8_ | (ulong)!(bool)(bVar28 & 1) * auVar43._0_8_;
              bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar46._8_8_ = (ulong)bVar29 * auVar63._8_8_ | (ulong)!bVar29 * auVar43._8_8_;
              auVar76._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * auVar63._16_8_;
              auVar76._0_16_ = auVar46;
              auVar76._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * auVar63._24_8_;
              auVar76._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * auVar63._32_8_;
              auVar76._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * auVar63._40_8_;
              auVar76._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * auVar63._48_8_;
              auVar76._56_8_ = (uVar30 >> 7) * auVar63._56_8_;
              auVar63 = vaddpd_avx512f(auVar76,auVar64);
              auVar43 = vxorpd_avx512vl(auVar46,auVar46);
              vscatterqpd_avx512f(ZEXT864(8) + auVar56,uVar30,auVar63);
              auVar44 = vxorpd_avx512vl(auVar63._0_16_,auVar63._0_16_);
              auVar63 = vgatherqpd_avx512f(*(undefined8 *)(uVar39 + 8));
              auVar77._0_8_ =
                   (ulong)(bVar28 & 1) * auVar63._0_8_ | (ulong)!(bool)(bVar28 & 1) * auVar44._0_8_;
              bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar77._8_8_ = (ulong)bVar29 * auVar63._8_8_ | (ulong)!bVar29 * auVar44._8_8_;
              auVar77._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * auVar63._16_8_;
              auVar77._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * auVar63._24_8_;
              auVar77._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * auVar63._32_8_;
              auVar77._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * auVar63._40_8_;
              auVar77._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * auVar63._48_8_;
              auVar77._56_8_ = (uVar30 >> 7) * auVar63._56_8_;
              auVar63 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar20->jx + (long)&pcVar19->bx))
              ;
              auVar47._0_8_ =
                   (ulong)(bVar28 & 1) * auVar63._0_8_ | (ulong)!(bool)(bVar28 & 1) * auVar43._0_8_;
              bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar47._8_8_ = (ulong)bVar29 * auVar63._8_8_ | (ulong)!bVar29 * auVar43._8_8_;
              auVar78._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * auVar63._16_8_;
              auVar78._0_16_ = auVar47;
              auVar78._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * auVar63._24_8_;
              auVar78._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * auVar63._32_8_;
              auVar78._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * auVar63._40_8_;
              auVar78._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * auVar63._48_8_;
              auVar78._56_8_ = (uVar30 >> 7) * auVar63._56_8_;
              auVar63 = vsubpd_avx512f(auVar73,auVar77);
              auVar64 = vsubpd_avx512f(auVar70,auVar78);
              auVar43 = vxorpd_avx512vl(auVar47,auVar47);
              auVar69 = vgatherqpd_avx512f(*(undefined8 *)(uVar38 + 0x10));
              auVar79._0_8_ =
                   (ulong)(bVar28 & 1) * auVar69._0_8_ | (ulong)!(bool)(bVar28 & 1) * auVar43._0_8_;
              bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar79._8_8_ = (ulong)bVar29 * auVar69._8_8_ | (ulong)!bVar29 * auVar43._8_8_;
              auVar79._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * auVar69._16_8_;
              auVar79._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * auVar69._24_8_;
              auVar79._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * auVar69._32_8_;
              auVar79._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * auVar69._40_8_;
              auVar79._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * auVar69._48_8_;
              auVar79._56_8_ = (uVar30 >> 7) * auVar69._56_8_;
              auVar64 = vmulpd_avx512f(auVar64,auVar61);
              auVar63 = vfmadd231pd_avx512f(auVar64,auVar54,auVar63);
              in_ZMM26 = vfnmadd213pd_avx512f(auVar79,auVar58,auVar63);
              auVar43 = vxorpd_avx512vl(auVar63._0_16_,auVar63._0_16_);
              auVar63 = vgatherqpd_avx512f(*(undefined8 *)(uVar40 + 0x10));
              auVar80._0_8_ =
                   (ulong)(bVar28 & 1) * auVar63._0_8_ | (ulong)!(bool)(bVar28 & 1) * auVar43._0_8_;
              bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar80._8_8_ = (ulong)bVar29 * auVar63._8_8_ | (ulong)!bVar29 * auVar43._8_8_;
              auVar80._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * auVar63._16_8_;
              auVar80._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * auVar63._24_8_;
              auVar80._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * auVar63._32_8_;
              auVar80._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * auVar63._40_8_;
              auVar80._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * auVar63._48_8_;
              auVar80._56_8_ = (uVar30 >> 7) * auVar63._56_8_;
              auVar63 = vaddpd_avx512f(auVar80,in_ZMM26);
              vscatterqpd_avx512f(ZEXT864(0x10) + auVar56,uVar30,auVar63);
              auVar63 = auVar70;
              auVar64 = auVar73;
            } while (((ulong)(uVar15 - 1) + 6 & 0x1fffffff8) != uVar35);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != uVar40);
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 != uVar37);
  }
  if (2 < iVar14) {
    auVar48 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar50 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar51 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar85._8_8_ = 0;
    auVar85._0_8_ = (this->super_maxwell_solver).dtdz;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this->super_maxwell_solver).dtdy;
    auVar52 = vbroadcastsd_avx512f(auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (this->super_maxwell_solver).dx;
    auVar53 = vbroadcastsd_avx512f(auVar9);
    auVar31._8_8_ = 0x8000000000000000;
    auVar31._0_8_ = 0x8000000000000000;
    auVar43 = vxorpd_avx512vl(auVar85,auVar31);
    auVar54 = vpbroadcastq_avx512f();
    uVar38 = 1;
    auVar55 = vbroadcastsd_avx512f(auVar43);
    do {
      if (2 < (int)uVar15) {
        uVar40 = 0;
        auVar56 = vmovdqa64_avx512f(auVar48);
        ppcVar17 = *(((this->super_maxwell_solver).cb)->p)._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
        auVar57 = vpbroadcastq_avx512f();
        pdVar42 = &ppcVar17[uVar38][-1].by;
        pcVar21 = (*(pfVar16->p)._M_t.
                    super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                    super__Head_base<0UL,_celle_***,_false>._M_head_impl)[uVar38];
        do {
          auVar58 = vpbroadcastq_avx512f();
          auVar59 = vpmullq_avx512dq(auVar56,auVar50);
          uVar40 = uVar40 + 8;
          auVar56 = vpaddq_avx512f(auVar56,auVar51);
          auVar58 = vporq_avx512f(auVar58,auVar49);
          uVar41 = vpcmpuq_avx512f(auVar58,auVar54,2);
          vpaddq_avx512f(auVar57,auVar59);
          auVar58 = vgatherqpd_avx512f(*(undefined8 *)(uVar38 + 0x10));
          bVar28 = (byte)uVar41;
          auVar60._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar58._8_8_;
          auVar60._0_8_ = (ulong)(bVar28 & 1) * auVar58._0_8_;
          auVar60._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar58._16_8_;
          auVar60._24_8_ = (ulong)((byte)(uVar41 >> 3) & 1) * auVar58._24_8_;
          auVar60._32_8_ = (ulong)((byte)(uVar41 >> 4) & 1) * auVar58._32_8_;
          auVar60._40_8_ = (ulong)((byte)(uVar41 >> 5) & 1) * auVar58._40_8_;
          auVar60._48_8_ = (ulong)((byte)(uVar41 >> 6) & 1) * auVar58._48_8_;
          auVar60._56_8_ = (uVar41 >> 7) * auVar58._56_8_;
          auVar58 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&ppcVar17[uVar38 - 1]->bz + (long)pdVar42));
          auVar61._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar58._8_8_;
          auVar61._0_8_ = (ulong)(bVar28 & 1) * auVar58._0_8_;
          auVar61._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar58._16_8_;
          auVar61._24_8_ = (ulong)((byte)(uVar41 >> 3) & 1) * auVar58._24_8_;
          auVar61._32_8_ = (ulong)((byte)(uVar41 >> 4) & 1) * auVar58._32_8_;
          auVar61._40_8_ = (ulong)((byte)(uVar41 >> 5) & 1) * auVar58._40_8_;
          auVar61._48_8_ = (ulong)((byte)(uVar41 >> 6) & 1) * auVar58._48_8_;
          auVar61._56_8_ = (uVar41 >> 7) * auVar58._56_8_;
          auVar58 = vsubpd_avx512f(auVar60,auVar61);
          auVar60 = vgatherqpd_avx512f(*(undefined8 *)(uVar38 + 8));
          auVar63._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar60._8_8_;
          auVar63._0_8_ = (ulong)(bVar28 & 1) * auVar60._0_8_;
          auVar63._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar60._16_8_;
          auVar63._24_8_ = (ulong)((byte)(uVar41 >> 3) & 1) * auVar60._24_8_;
          auVar63._32_8_ = (ulong)((byte)(uVar41 >> 4) & 1) * auVar60._32_8_;
          auVar63._40_8_ = (ulong)((byte)(uVar41 >> 5) & 1) * auVar60._40_8_;
          auVar63._48_8_ = (ulong)((byte)(uVar41 >> 6) & 1) * auVar60._48_8_;
          auVar63._56_8_ = (uVar41 >> 7) * auVar60._56_8_;
          auVar60 = vgatherqpd_avx512f(*(undefined8 *)((long)pdVar42 * 2));
          auVar62._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar60._8_8_;
          auVar62._0_8_ = (ulong)(bVar28 & 1) * auVar60._0_8_;
          auVar62._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar60._16_8_;
          auVar62._24_8_ = (ulong)((byte)(uVar41 >> 3) & 1) * auVar60._24_8_;
          auVar62._32_8_ = (ulong)((byte)(uVar41 >> 4) & 1) * auVar60._32_8_;
          auVar62._40_8_ = (ulong)((byte)(uVar41 >> 5) & 1) * auVar60._40_8_;
          auVar62._48_8_ = (ulong)((byte)(uVar41 >> 6) & 1) * auVar60._48_8_;
          auVar62._56_8_ = (uVar41 >> 7) * auVar60._56_8_;
          auVar60 = vsubpd_avx512f(auVar63,auVar62);
          auVar60 = vmulpd_avx512f(auVar60,auVar55);
          auVar58 = vfmadd231pd_avx512f(auVar60,auVar52,auVar58);
          auVar60 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&(*(((this->super_maxwell_solver).cj)->p)._M_t.
                                                  super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>
                                                  .super__Head_base<0UL,_cellj_***,_false>.
                                                  _M_head_impl)[uVar38]->jx + (long)pdVar42));
          auVar65._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar60._8_8_;
          auVar65._0_8_ = (ulong)(bVar28 & 1) * auVar60._0_8_;
          auVar65._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar60._16_8_;
          auVar65._24_8_ = (ulong)((byte)(uVar41 >> 3) & 1) * auVar60._24_8_;
          auVar65._32_8_ = (ulong)((byte)(uVar41 >> 4) & 1) * auVar60._32_8_;
          auVar65._40_8_ = (ulong)((byte)(uVar41 >> 5) & 1) * auVar60._40_8_;
          auVar65._48_8_ = (ulong)((byte)(uVar41 >> 6) & 1) * auVar60._48_8_;
          auVar65._56_8_ = (uVar41 >> 7) * auVar60._56_8_;
          auVar58 = vfnmadd213pd_avx512f(auVar65,auVar53,auVar58);
          auVar60 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar21->ex + (long)pdVar42));
          auVar66._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar60._8_8_;
          auVar66._0_8_ = (ulong)(bVar28 & 1) * auVar60._0_8_;
          auVar66._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar60._16_8_;
          auVar66._24_8_ = (ulong)((byte)(uVar41 >> 3) & 1) * auVar60._24_8_;
          auVar66._32_8_ = (ulong)((byte)(uVar41 >> 4) & 1) * auVar60._32_8_;
          auVar66._40_8_ = (ulong)((byte)(uVar41 >> 5) & 1) * auVar60._40_8_;
          auVar66._48_8_ = (ulong)((byte)(uVar41 >> 6) & 1) * auVar60._48_8_;
          auVar66._56_8_ = (uVar41 >> 7) * auVar60._56_8_;
          auVar58 = vaddpd_avx512f(auVar58,auVar66);
          vscatterqpd_avx512f(ZEXT864(pcVar21) + auVar59,uVar41,auVar58);
        } while (((ulong)(uVar15 - 1) + 6 & 0x1fffffff8) != uVar40);
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != uVar36);
  }
  if (2 < (int)uVar13) {
    auVar48 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar50 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar51 = vpbroadcastq_avx512f(ZEXT816(8));
    uVar38 = 1;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = (this->super_maxwell_solver).dtdx;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (this->super_maxwell_solver).dtdz;
    auVar52 = vbroadcastsd_avx512f(auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (this->super_maxwell_solver).dy;
    auVar53 = vbroadcastsd_avx512f(auVar11);
    auVar32._8_8_ = 0x8000000000000000;
    auVar32._0_8_ = 0x8000000000000000;
    auVar43 = vxorpd_avx512vl(auVar86,auVar32);
    auVar54 = vpbroadcastq_avx512f();
    auVar55 = vbroadcastsd_avx512f(auVar43);
    do {
      if (2 < (int)uVar15) {
        pppcVar22 = (((this->super_maxwell_solver).cb)->p)._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
        uVar40 = 0;
        auVar56 = vmovdqa64_avx512f(auVar48);
        pcVar18 = *pppcVar22[uVar38];
        auVar57 = vpbroadcastq_avx512f();
        auVar58 = vpbroadcastq_avx512f();
        do {
          auVar59 = vpbroadcastq_avx512f();
          auVar60 = vpmullq_avx512dq(auVar56,auVar50);
          uVar40 = uVar40 + 8;
          auVar56 = vpaddq_avx512f(auVar56,auVar51);
          auVar59 = vporq_avx512f(auVar59,auVar49);
          uVar41 = vpcmpuq_avx512f(auVar59,auVar54,2);
          vpaddq_avx512f(auVar57,auVar60);
          auVar59 = vpaddq_avx512f(auVar58,auVar60);
          auVar60 = vgatherqpd_avx512f(*(undefined8 *)((ulong)uVar13 + 0x10));
          bVar28 = (byte)uVar41;
          auVar67._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar60._8_8_;
          auVar67._0_8_ = (ulong)(bVar28 & 1) * auVar60._0_8_;
          auVar67._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar60._16_8_;
          auVar67._24_8_ = (ulong)((byte)(uVar41 >> 3) & 1) * auVar60._24_8_;
          auVar67._32_8_ = (ulong)((byte)(uVar41 >> 4) & 1) * auVar60._32_8_;
          auVar67._40_8_ = (ulong)((byte)(uVar41 >> 5) & 1) * auVar60._40_8_;
          auVar67._48_8_ = (ulong)((byte)(uVar41 >> 6) & 1) * auVar60._48_8_;
          auVar67._56_8_ = (uVar41 >> 7) * auVar60._56_8_;
          auVar60 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&(*pppcVar22[uVar38 - 1])->bx +
                                        (long)&(pfVar16->p)._M_t.
                                               super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>
                                               .super__Head_base<0UL,_celle_***,_false>));
          auVar68._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar60._8_8_;
          auVar68._0_8_ = (ulong)(bVar28 & 1) * auVar60._0_8_;
          auVar68._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar60._16_8_;
          auVar68._24_8_ = (ulong)((byte)(uVar41 >> 3) & 1) * auVar60._24_8_;
          auVar68._32_8_ = (ulong)((byte)(uVar41 >> 4) & 1) * auVar60._32_8_;
          auVar68._40_8_ = (ulong)((byte)(uVar41 >> 5) & 1) * auVar60._40_8_;
          auVar68._48_8_ = (ulong)((byte)(uVar41 >> 6) & 1) * auVar60._48_8_;
          auVar68._56_8_ = (uVar41 >> 7) * auVar60._56_8_;
          auVar60 = vsubpd_avx512f(auVar67,auVar68);
          auVar61 = vgatherqpd_avx512f(*(undefined8 *)((long)&pfVar16->nx + (long)pcVar18));
          auVar81._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar61._8_8_;
          auVar81._0_8_ = (ulong)(bVar28 & 1) * auVar61._0_8_;
          auVar81._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar61._16_8_;
          auVar81._24_8_ = (ulong)((byte)(uVar41 >> 3) & 1) * auVar61._24_8_;
          auVar81._32_8_ = (ulong)((byte)(uVar41 >> 4) & 1) * auVar61._32_8_;
          auVar81._40_8_ = (ulong)((byte)(uVar41 >> 5) & 1) * auVar61._40_8_;
          auVar81._48_8_ = (ulong)((byte)(uVar41 >> 6) & 1) * auVar61._48_8_;
          auVar81._56_8_ = (uVar41 >> 7) * auVar61._56_8_;
          auVar61 = vgatherqpd_avx512f(*(undefined8 *)((ulong)uVar13 - 0x18));
          auVar82._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar61._8_8_;
          auVar82._0_8_ = (ulong)(bVar28 & 1) * auVar61._0_8_;
          auVar82._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar61._16_8_;
          auVar82._24_8_ = (ulong)((byte)(uVar41 >> 3) & 1) * auVar61._24_8_;
          auVar82._32_8_ = (ulong)((byte)(uVar41 >> 4) & 1) * auVar61._32_8_;
          auVar82._40_8_ = (ulong)((byte)(uVar41 >> 5) & 1) * auVar61._40_8_;
          auVar82._48_8_ = (ulong)((byte)(uVar41 >> 6) & 1) * auVar61._48_8_;
          auVar82._56_8_ = (uVar41 >> 7) * auVar61._56_8_;
          auVar61 = vsubpd_avx512f(auVar81,auVar82);
          auVar61 = vmulpd_avx512f(auVar52,auVar61);
          auVar60 = vfmadd231pd_avx512f(auVar61,auVar55,auVar60);
          auVar61 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&pfVar16->nz +
                                        (long)*(((this->super_maxwell_solver).cj)->p)._M_t.
                                               super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>
                                               .super__Head_base<0UL,_cellj_***,_false>._M_head_impl
                                               [uVar38]));
          auVar83._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar61._8_8_;
          auVar83._0_8_ = (ulong)(bVar28 & 1) * auVar61._0_8_;
          auVar83._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar61._16_8_;
          auVar83._24_8_ = (ulong)((byte)(uVar41 >> 3) & 1) * auVar61._24_8_;
          auVar83._32_8_ = (ulong)((byte)(uVar41 >> 4) & 1) * auVar61._32_8_;
          auVar83._40_8_ = (ulong)((byte)(uVar41 >> 5) & 1) * auVar61._40_8_;
          auVar83._48_8_ = (ulong)((byte)(uVar41 >> 6) & 1) * auVar61._48_8_;
          auVar83._56_8_ = (uVar41 >> 7) * auVar61._56_8_;
          auVar60 = vfnmadd213pd_avx512f(auVar83,auVar53,auVar60);
          auVar61 = vgatherqpd_avx512f(pcVar18->by);
          auVar84._8_8_ = (ulong)((byte)(uVar41 >> 1) & 1) * auVar61._8_8_;
          auVar84._0_8_ = (ulong)(bVar28 & 1) * auVar61._0_8_;
          auVar84._16_8_ = (ulong)((byte)(uVar41 >> 2) & 1) * auVar61._16_8_;
          auVar84._24_8_ = (ulong)((byte)(uVar41 >> 3) & 1) * auVar61._24_8_;
          auVar84._32_8_ = (ulong)((byte)(uVar41 >> 4) & 1) * auVar61._32_8_;
          auVar84._40_8_ = (ulong)((byte)(uVar41 >> 5) & 1) * auVar61._40_8_;
          auVar84._48_8_ = (ulong)((byte)(uVar41 >> 6) & 1) * auVar61._48_8_;
          auVar84._56_8_ = (uVar41 >> 7) * auVar61._56_8_;
          auVar60 = vaddpd_avx512f(auVar60,auVar84);
          vscatterqpd_avx512f(ZEXT864(8) + auVar59,uVar41,auVar60);
        } while (((ulong)(uVar15 - 1) + 6 & 0x1fffffff8) != uVar40);
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != uVar37);
    if (2 < (int)uVar13) {
      uVar38 = 1;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = (this->super_maxwell_solver).dtdy;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = (this->super_maxwell_solver).dtdx;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = (this->super_maxwell_solver).dz;
      pfVar23 = (this->super_maxwell_solver).cb;
      pfVar24 = (this->super_maxwell_solver).cj;
      auVar33._8_8_ = 0x8000000000000000;
      auVar33._0_8_ = 0x8000000000000000;
      auVar43 = vxorpd_avx512vl(auVar88,auVar33);
      do {
        if (2 < iVar14) {
          pppcVar22 = (pfVar23->p)._M_t.
                      super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                      super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
          uVar40 = 1;
          ppcVar17 = pppcVar22[uVar38 - 1];
          ppcVar25 = pppcVar22[uVar38];
          ppcVar26 = (pfVar24->p)._M_t.
                     super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                     super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                     super__Head_base<0UL,_cellj_***,_false>._M_head_impl[uVar38];
          ppcVar27 = (pfVar16->p)._M_t.
                     super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                     super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                     super__Head_base<0UL,_celle_***,_false>._M_head_impl[uVar38];
          do {
            pcVar18 = ppcVar25[uVar40];
            lVar34 = uVar40 - 1;
            ppcVar1 = ppcVar17 + uVar40;
            pcVar21 = ppcVar27[uVar40];
            ppcVar2 = ppcVar26 + uVar40;
            uVar40 = uVar40 + 1;
            auVar90._8_8_ = 0;
            auVar90._0_8_ = (pcVar18->bx - ppcVar25[lVar34]->bx) * auVar43._0_8_;
            auVar91._8_8_ = 0;
            auVar91._0_8_ = pcVar18->by - (*ppcVar1)->by;
            auVar44 = vfmadd231sd_fma(auVar90,auVar87,auVar91);
            auVar12._8_8_ = 0;
            auVar12._0_8_ = (*ppcVar2)->jz;
            auVar44 = vfnmadd231sd_fma(auVar44,auVar89,auVar12);
            pcVar21->ez = auVar44._0_8_ + pcVar21->ez;
          } while (uVar36 != uVar40);
        }
        uVar38 = uVar38 + 1;
      } while (uVar38 != uVar37);
    }
  }
  return;
}

Assistant:

void fdtd_solver::advance_e()
{
    const int nx = ce.get_nx();
    const int ny = ce.get_ny();
    const int nz = ce.get_nz();

    for(int i=1;i<nx-1;i++) {
        for(int j=1;j<ny-1;j++) {
            for(int k=1;k<nz-1;k++) {
                ce[i][j][k].ex +=  dtdy*(cb[i][j][k].bz-cb[i][j-1][k].bz) - dtdz*(cb[i][j][k].by-cb[i][j][k-1].by) - cj[i][j][k].jx*dx;
                ce[i][j][k].ey += -dtdx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + dtdz*(cb[i][j][k].bx-cb[i][j][k-1].bx) - cj[i][j][k].jy*dy;
                ce[i][j][k].ez +=  dtdx*(cb[i][j][k].by-cb[i-1][j][k].by) - dtdy*(cb[i][j][k].bx-cb[i][j-1][k].bx) - cj[i][j][k].jz*dz;
            }
        }
    }
    {int i=0;
        for(int j=1;j<ny-1;j++) {
            for(int k=1;k<nz-1;k++) {
                ce[i][j][k].ex +=  dtdy*(cb[i][j][k].bz-cb[i][j-1][k].bz) - dtdz*(cb[i][j][k].by-cb[i][j][k-1].by) - cj[i][j][k].jx*dx;
            }
        }
    }
    for(int i=1;i<nx-1;i++) {
        {int j=0;
            for(int k=1;k<nz-1;k++) {
                ce[i][j][k].ey += -dtdx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + dtdz*(cb[i][j][k].bx-cb[i][j][k-1].bx) - cj[i][j][k].jy*dy;
            }
        }
    }
    for(int i=1;i<nx-1;i++) {
        for(int j=1;j<ny-1;j++) {
            {int k=0;
                ce[i][j][k].ez +=  dtdx*(cb[i][j][k].by-cb[i-1][j][k].by) - dtdy*(cb[i][j][k].bx-cb[i][j-1][k].bx) - cj[i][j][k].jz*dz;
            }
        }
    }
}